

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QRect __thiscall QAccessibleButton::rect(QAccessibleButton *this)

{
  bool bVar1;
  QRect *this_00;
  QPoint *p;
  QStyle *pQVar2;
  QWidget *this_01;
  long in_FS_OFFSET;
  QRadioButton *rb;
  QCheckBox *cb;
  QAbstractButton *ab;
  QPoint wpos_1;
  QPoint wpos;
  QStyleOptionButton opt_1;
  QStyleOptionButton opt;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  QStyleOptionButton *in_stack_fffffffffffffe80;
  QPoint *in_stack_fffffffffffffe88;
  QWidget *in_stack_fffffffffffffe90;
  QWidget *pQVar3;
  QRect local_f8;
  undefined1 local_e8 [112];
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)button((QAccessibleButton *)0x7ee090);
  bVar1 = QWidget::isVisible((QWidget *)0x7ee09f);
  if (bVar1) {
    p = (QPoint *)qobject_cast<QCheckBox*>((QObject *)0x7ee0bf);
    if (p == (QPoint *)0x0) {
      this_01 = (QWidget *)qobject_cast<QRadioButton*>((QObject *)0x7ee1be);
      if (this_01 == (QWidget *)0x0) {
        local_f8 = QAccessibleWidget::rect((QAccessibleWidget *)0x0);
      }
      else {
        pQVar3 = this_01;
        QPoint::QPoint((QPoint *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                       in_stack_fffffffffffffe78);
        QWidget::mapToGlobal(this_01,in_stack_fffffffffffffe88);
        memset(local_e8,0xaa,0x70);
        QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x7ee22b);
        (**(code **)(*(long *)pQVar3 + 0x1b8))(pQVar3,local_e8);
        pQVar2 = QWidget::style((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        (**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,9,local_e8,pQVar3);
        local_f8 = QRect::translated(this_00,p);
        QStyleOptionButton::~QStyleOptionButton(in_stack_fffffffffffffe80);
      }
    }
    else {
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                     in_stack_fffffffffffffe78);
      QWidget::mapToGlobal(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      memset(local_78,0xaa,0x70);
      QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x7ee138);
      (**(code **)((long)*p + 0x1b8))(p,local_78);
      pQVar2 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      (**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,5,local_78,p);
      local_f8 = QRect::translated(this_00,p);
      QStyleOptionButton::~QStyleOptionButton(in_stack_fffffffffffffe80);
    }
  }
  else {
    QRect::QRect((QRect *)in_stack_fffffffffffffe80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_f8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleButton::rect() const
{
    QAbstractButton *ab = button();
    if (!ab->isVisible())
        return QRect();

#if QT_CONFIG(checkbox)
    if (QCheckBox *cb = qobject_cast<QCheckBox *>(ab)) {
        QPoint wpos = cb->mapToGlobal(QPoint(0, 0));
        QStyleOptionButton opt;
        cb->initStyleOption(&opt);
        return cb->style()->subElementRect(QStyle::SE_CheckBoxClickRect, &opt, cb).translated(wpos);
    }
#endif
#if QT_CONFIG(radiobutton)
    else if (QRadioButton *rb = qobject_cast<QRadioButton *>(ab)) {
        QPoint wpos = rb->mapToGlobal(QPoint(0, 0));
        QStyleOptionButton opt;
        rb->initStyleOption(&opt);
        return rb->style()->subElementRect(QStyle::SE_RadioButtonClickRect, &opt, rb).translated(wpos);
    }
#endif
    return QAccessibleWidget::rect();
}